

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

ComponentType dxil_spv::Converter::Impl::get_effective_typed_resource_type(ComponentType type)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,type);
  if (iVar1 == 8) {
    return F32;
  }
  if (iVar1 != 3) {
    if (iVar1 == 2) {
      iVar1 = 4;
    }
    return (ComponentType)iVar1;
  }
  return U32;
}

Assistant:

static DXIL::ComponentType convert_16bit_component_to_32bit(DXIL::ComponentType type)
{
	switch (type)
	{
	case DXIL::ComponentType::F16:
		return DXIL::ComponentType::F32;
	case DXIL::ComponentType::I16:
		return DXIL::ComponentType::I32;
	case DXIL::ComponentType::U16:
		return DXIL::ComponentType::U32;
	default:
		return type;
	}
}